

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# http.c
# Opt level: O1

CURLcode output_auth_headers(Curl_easy *data,connectdata *conn,auth *authstatus,char *request,
                            char *path,_Bool proxy)

{
  unsigned_long uVar1;
  char *pcVar2;
  CURLcode CVar3;
  char *pcVar4;
  size_t insize;
  char *pcVar5;
  long lVar6;
  char *pcVar7;
  char *authorization;
  size_t size;
  char *local_40;
  size_t local_38;
  
  uVar1 = authstatus->picked;
  pcVar7 = (char *)0x0;
  if (7 < (long)uVar1) {
    if (uVar1 == 8) {
      CVar3 = Curl_output_ntlm(data,proxy);
      if (CVar3 != CURLE_OK) {
        return CVar3;
      }
      pcVar7 = "NTLM";
    }
    else if (uVar1 == 0x80) {
      CVar3 = Curl_output_aws_sigv4(data,proxy);
      if (CVar3 != CURLE_OK) {
        return CVar3;
      }
      pcVar7 = "AWS_SIGV4";
    }
    goto LAB_00123a83;
  }
  if (uVar1 != 1) {
    if (uVar1 == 2) {
      CVar3 = Curl_output_digest(data,proxy,(uchar *)request,(uchar *)path);
      if (CVar3 != CURLE_OK) {
        return CVar3;
      }
      pcVar7 = "Digest";
    }
    goto LAB_00123a83;
  }
  if (proxy) {
    if ((((conn->bits).field_0x4 & 4) == 0) ||
       (pcVar7 = Curl_checkProxyheaders(data,conn,"Proxy-authorization"), pcVar7 != (char *)0x0)) {
      if (!proxy) goto LAB_00123a38;
      goto LAB_00123a5b;
    }
LAB_00123b71:
    local_38 = 0;
    local_40 = (char *)0x0;
    lVar6 = 0x1300;
    if (proxy) {
      lVar6 = 0x12e8;
    }
    pcVar7 = (&(data->state).aptr.passwd)[(ulong)proxy * 2];
    if (pcVar7 == (char *)0x0) {
      pcVar7 = "";
    }
    pcVar7 = curl_maprintf("%s:%s",(&(data->state).aptr.user)[(ulong)proxy * 2],pcVar7);
    if (pcVar7 == (char *)0x0) {
      CVar3 = CURLE_OUT_OF_MEMORY;
    }
    else {
      insize = strlen(pcVar7);
      CVar3 = Curl_base64_encode(data,pcVar7,insize,&local_40,&local_38);
      if (CVar3 == CURLE_OK) {
        if (local_40 == (char *)0x0) {
          CVar3 = CURLE_REMOTE_ACCESS_DENIED;
        }
        else {
          (*Curl_cfree)(*(void **)((long)&data->magic + lVar6));
          pcVar4 = "";
          if (proxy) {
            pcVar4 = "Proxy-";
          }
          pcVar4 = curl_maprintf("%sAuthorization: Basic %s\r\n",pcVar4,local_40);
          *(char **)((long)&data->magic + lVar6) = pcVar4;
          (*Curl_cfree)(local_40);
          CVar3 = CURLE_OUT_OF_MEMORY;
          if (*(long *)((long)&data->magic + lVar6) != 0) {
            CVar3 = CURLE_OK;
          }
        }
      }
      (*Curl_cfree)(pcVar7);
    }
    if (CVar3 != CURLE_OK) {
      return CVar3;
    }
    pcVar7 = "Basic";
  }
  else {
LAB_00123a38:
    if ((((conn->bits).field_0x5 & 8) != 0) &&
       (pcVar7 = Curl_checkheaders(data,"Authorization"), pcVar7 == (char *)0x0)) goto LAB_00123b71;
LAB_00123a5b:
    pcVar7 = (char *)0x0;
  }
  authstatus->field_0x18 = authstatus->field_0x18 | 1;
LAB_00123a83:
  if (authstatus->picked == 0x40) {
    if (((!proxy) && ((data->set).str[0x41] != (char *)0x0)) &&
       (pcVar4 = Curl_checkheaders(data,"Authorization"), pcVar4 == (char *)0x0)) {
      (*Curl_cfree)((data->state).aptr.userpwd);
      pcVar7 = curl_maprintf("Authorization: Bearer %s\r\n",(data->set).str[0x41]);
      (data->state).aptr.userpwd = pcVar7;
      if (pcVar7 == (char *)0x0) {
        return CURLE_OUT_OF_MEMORY;
      }
      pcVar7 = "Bearer";
    }
    authstatus->field_0x18 = authstatus->field_0x18 | 1;
  }
  if (pcVar7 == (char *)0x0) {
    authstatus->field_0x18 = authstatus->field_0x18 & 0xfd;
  }
  else {
    pcVar4 = "Server";
    if (proxy) {
      pcVar4 = "Proxy";
    }
    pcVar2 = (&(data->state).aptr.user)[(ulong)proxy * 2];
    pcVar5 = "";
    if (pcVar2 != (char *)0x0) {
      pcVar5 = pcVar2;
    }
    Curl_infof(data,"%s auth using %s with user \'%s\'",pcVar4,pcVar7,pcVar5);
    authstatus->field_0x18 =
         (authstatus->field_0x18 & 0xfd | authstatus->field_0x18 * '\x02' & 2U) ^ 2;
  }
  return CURLE_OK;
}

Assistant:

static CURLcode
output_auth_headers(struct Curl_easy *data,
                    struct connectdata *conn,
                    struct auth *authstatus,
                    const char *request,
                    const char *path,
                    bool proxy)
{
  const char *auth = NULL;
  CURLcode result = CURLE_OK;

#ifdef CURL_DISABLE_CRYPTO_AUTH
  (void)request;
  (void)path;
#endif
#ifndef CURL_DISABLE_CRYPTO_AUTH
  if(authstatus->picked == CURLAUTH_AWS_SIGV4) {
    auth = "AWS_SIGV4";
    result = Curl_output_aws_sigv4(data, proxy);
    if(result)
      return result;
  }
  else
#endif
#ifdef USE_SPNEGO
  if(authstatus->picked == CURLAUTH_NEGOTIATE) {
    auth = "Negotiate";
    result = Curl_output_negotiate(data, conn, proxy);
    if(result)
      return result;
  }
  else
#endif
#ifdef USE_NTLM
  if(authstatus->picked == CURLAUTH_NTLM) {
    auth = "NTLM";
    result = Curl_output_ntlm(data, proxy);
    if(result)
      return result;
  }
  else
#endif
#if defined(USE_NTLM) && defined(NTLM_WB_ENABLED)
  if(authstatus->picked == CURLAUTH_NTLM_WB) {
    auth = "NTLM_WB";
    result = Curl_output_ntlm_wb(data, conn, proxy);
    if(result)
      return result;
  }
  else
#endif
#ifndef CURL_DISABLE_CRYPTO_AUTH
  if(authstatus->picked == CURLAUTH_DIGEST) {
    auth = "Digest";
    result = Curl_output_digest(data,
                                proxy,
                                (const unsigned char *)request,
                                (const unsigned char *)path);
    if(result)
      return result;
  }
  else
#endif
  if(authstatus->picked == CURLAUTH_BASIC) {
    /* Basic */
    if(
#ifndef CURL_DISABLE_PROXY
      (proxy && conn->bits.proxy_user_passwd &&
       !Curl_checkProxyheaders(data, conn, "Proxy-authorization")) ||
#endif
      (!proxy && conn->bits.user_passwd &&
       !Curl_checkheaders(data, "Authorization"))) {
      auth = "Basic";
      result = http_output_basic(data, proxy);
      if(result)
        return result;
    }

    /* NOTE: this function should set 'done' TRUE, as the other auth
       functions work that way */
    authstatus->done = TRUE;
  }
  if(authstatus->picked == CURLAUTH_BEARER) {
    /* Bearer */
    if((!proxy && data->set.str[STRING_BEARER] &&
        !Curl_checkheaders(data, "Authorization"))) {
      auth = "Bearer";
      result = http_output_bearer(data);
      if(result)
        return result;
    }

    /* NOTE: this function should set 'done' TRUE, as the other auth
       functions work that way */
    authstatus->done = TRUE;
  }

  if(auth) {
#ifndef CURL_DISABLE_PROXY
    infof(data, "%s auth using %s with user '%s'",
          proxy ? "Proxy" : "Server", auth,
          proxy ? (data->state.aptr.proxyuser ?
                   data->state.aptr.proxyuser : "") :
          (data->state.aptr.user ?
           data->state.aptr.user : ""));
#else
    infof(data, "Server auth using %s with user '%s'",
          auth, data->state.aptr.user ?
          data->state.aptr.user : "");
#endif
    authstatus->multipass = (!authstatus->done) ? TRUE : FALSE;
  }
  else
    authstatus->multipass = FALSE;

  return CURLE_OK;
}